

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O0

void __thiscall
license::EventRegistry::exportLastEvents
          (EventRegistry *this,AuditEvent_conflict *auditEvents,int nlogs)

{
  size_type sVar1;
  int *piVar2;
  iterator __last;
  __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_> local_38;
  __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_> local_30;
  int local_24;
  int local_20;
  int local_1c;
  int sizeToCopy;
  int nlogs_local;
  AuditEvent_conflict *auditEvents_local;
  EventRegistry *this_local;
  
  local_1c = nlogs;
  _sizeToCopy = auditEvents;
  auditEvents_local = (AuditEvent_conflict *)this;
  sVar1 = std::vector<AuditEvent,_std::allocator<AuditEvent>_>::size(&this->logs);
  local_24 = (int)sVar1;
  piVar2 = std::min<int>(&local_1c,&local_24);
  local_20 = *piVar2;
  local_38._M_current =
       (anon_struct_1288_4_4db92441 *)
       std::vector<AuditEvent,_std::allocator<AuditEvent>_>::end(&this->logs);
  local_30 = __gnu_cxx::
             __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
             ::operator-(&local_38,(long)local_20);
  __last = std::vector<AuditEvent,_std::allocator<AuditEvent>_>::end(&this->logs);
  std::
  copy<__gnu_cxx::__normal_iterator<AuditEvent*,std::vector<AuditEvent,std::allocator<AuditEvent>>>,AuditEvent*>
            (local_30,(__normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
                       )__last._M_current,_sizeToCopy);
  return;
}

Assistant:

void EventRegistry::exportLastEvents(AuditEvent *auditEvents, int nlogs) {
	const int sizeToCopy = min(nlogs, (int)logs.size());
	std::copy(logs.end() - sizeToCopy, logs.end(), auditEvents);
}